

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O0

int file_gets(BIO *bp,char *buf,int size)

{
  char *pcVar1;
  size_t sVar2;
  int size_local;
  char *buf_local;
  BIO *bp_local;
  
  if (size == 0) {
    bp_local._4_4_ = 0;
  }
  else {
    pcVar1 = fgets(buf,size,(FILE *)bp->ptr);
    if (pcVar1 == (char *)0x0) {
      *buf = '\0';
      bp_local._4_4_ = 0;
    }
    else {
      sVar2 = strlen(buf);
      bp_local._4_4_ = (int)sVar2;
    }
  }
  return bp_local._4_4_;
}

Assistant:

static int file_gets(BIO *bp, char *buf, int size) {
  if (size == 0) {
    return 0;
  }

  if (!fgets(buf, size, (FILE *)bp->ptr)) {
    buf[0] = 0;
    // TODO(davidben): This doesn't distinguish error and EOF. This should check
    // |ferror| as in |file_read|.
    return 0;
  }

  return (int)strlen(buf);
}